

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O3

Node * __thiscall Parser::createAccessMemberNode(Parser *this,Token *t,Node *container,Node *key)

{
  pointer *pppNVar1;
  iterator __position;
  Node *this_00;
  Node *local_30;
  Node *local_28;
  
  if (key == (Node *)0x0 || container == (Node *)0x0) {
    this_00 = (Node *)0x0;
  }
  else {
    local_30 = key;
    local_28 = container;
    this_00 = (Node *)operator_new(0x30);
    CompilationContext::Poolable::Poolable((Poolable *)this_00,this->ctx);
    this_00->tok = t;
    (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_00->nodeType = PNT_ACCESS_MEMBER;
    std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
              ((vector<Node*,std::allocator<Node*>> *)&this_00->children,(iterator)0x0,&local_28);
    __position._M_current =
         (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                ((vector<Node*,std::allocator<Node*>> *)&this_00->children,__position,&local_30);
    }
    else {
      *__position._M_current = key;
      pppNVar1 = &(this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppNVar1 = *pppNVar1 + 1;
    }
  }
  return this_00;
}

Assistant:

Node * createAccessMemberNode(Token & t, Node * container, Node * key)
  {
    if (!container || !key)
      return nullptr;

    Node * n = new Node(ctx, t);
    n->nodeType = PNT_ACCESS_MEMBER;
    n->children.push_back(container);
    n->children.push_back(key);
    return n;
  }